

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void __thiscall VmValue::RemoveUse(VmValue *this,VmValue *user)

{
  int iVar1;
  VmValue **ppVVar2;
  char *pcVar3;
  VmBlock *this_00;
  bool bVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int local_14;
  VmConstant *local_10;
  
  uVar6 = (this->users).count;
  if (uVar6 != 0) {
    ppVVar2 = (this->users).data;
    lVar5 = 0;
    do {
      if (ppVVar2[lVar5] == user) {
        uVar6 = (this->users).count;
        if (uVar6 == 0) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x172,"T &SmallArray<VmValue *, 8>::back() [T = VmValue *, N = 8]");
        }
        uVar6 = uVar6 - 1;
        ppVVar2[lVar5] = ppVVar2[uVar6];
        (this->users).count = uVar6;
        this->hasKnownNonSimpleUse = false;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (uVar6 != (uint)lVar5);
  }
  if ((((this->users).count == 0) && (this->hasSideEffects == false)) &&
     (this->canBeRemoved == true)) {
    uVar6 = this->typeID;
    if (uVar6 == 1) {
      pcVar3 = this[1].comment.end;
      if (pcVar3 != (char *)0x0) {
        iVar1 = *(int *)(pcVar3 + 0x50);
        if (iVar1 != 0) {
          lVar5 = *(long *)(pcVar3 + 0x48);
          lVar7 = 0;
          do {
            if (*(VmValue **)(lVar5 + lVar7 * 8) == this) {
              *(undefined8 *)(lVar5 + lVar7 * 8) = *(undefined8 *)(lVar5 + (ulong)(iVar1 - 1U) * 8);
              *(uint *)(pcVar3 + 0x50) = iVar1 - 1U;
              local_14 = *(int *)&this[1]._vptr_VmValue + 1;
              local_10 = (VmConstant *)0x0;
              SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
                        ((SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *)(pcVar3 + 0xa0),
                         &local_14,&local_10);
              return;
            }
            lVar7 = lVar7 + 1;
          } while (iVar1 != (int)lVar7);
        }
        __assert_fail("found",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x79a,"void VmValue::RemoveUse(VmValue *)");
      }
    }
    else if (uVar6 == 2) {
      this_00 = (VmBlock *)this[1].users.data;
      if (this_00 != (VmBlock *)0x0) {
        VmBlock::RemoveInstruction(this_00,(VmInstruction *)this);
        return;
      }
    }
    else if (uVar6 == 3) {
      bVar4 = VmBlock::HasExternalInstructionUsers((VmBlock *)this);
      if (!bVar4) {
        while (*(VmInstruction **)&this[1].hasSideEffects != (VmInstruction *)0x0) {
          VmBlock::RemoveInstruction((VmBlock *)this,*(VmInstruction **)&this[1].hasSideEffects);
        }
      }
    }
    else if (uVar6 != 4) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x7b1,"void VmValue::RemoveUse(VmValue *)");
    }
  }
  return;
}

Assistant:

void VmValue::RemoveUse(VmValue* user)
{
	for(unsigned i = 0, e = users.count; i < e; i++)
	{
		if(users.data[i] == user)
		{
			users.data[i] = users.back();
			users.pop_back();

			// Might have removed last non-simple use
			hasKnownNonSimpleUse = false;
			break;
		}
	}

	if(users.count == 0 && !hasSideEffects && canBeRemoved)
	{
		if(VmConstant *constant = getType<VmConstant>(this))
		{
			if(VariableData *container = constant->container)
			{
				bool found = false;

				for(unsigned i = 0; i < container->users.size(); i++)
				{
					if(container->users[i] == constant)
					{
						found = true;

						container->users[i] = container->users.back();
						container->users.pop_back();

						container->offsetUsers.insert(constant->iValue + 1, NULL);
						break;
					}
				}

				(void)found;

				assert(found);
			}
		}
		else if(VmInstruction *instruction = getType<VmInstruction>(this))
		{
			if(instruction->parent)
				instruction->parent->RemoveInstruction(instruction);
		}
		else if(VmBlock *block = getType<VmBlock>(this))
		{
			if(!block->HasExternalInstructionUsers())
			{
				// Remove all block instructions
				while(block->lastInstruction)
					block->RemoveInstruction(block->lastInstruction);
			}
		}
		else if(isType<VmFunction>(this))
		{
			// Do not remove functions
		}
		else
		{
			assert(!"unknown type");
		}
	}
}